

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.cpp
# Opt level: O0

void __thiscall
CNscContext::AddStructure
          (CNscContext *this,char *pszIdentifier,uchar *pauchStructData,size_t nStructDataSize)

{
  int iVar1;
  NscSymbol *pNVar2;
  CNscContext *this_00;
  CNscContext *this_01;
  long in_RCX;
  CNscSymbolTable *in_RDX;
  CNscContext *in_RDI;
  size_t nExtra;
  NscPCodeHeader *p;
  uchar *pauchEnd;
  uchar *pauchData;
  NscSymbolStructExtra sExtra;
  size_t nSymbol;
  NscSymbol *pSymbol;
  NscType nType;
  size_t in_stack_ffffffffffffffa0;
  CNscSymbolTable *in_stack_ffffffffffffffa8;
  CNscSymbolTable *this_02;
  CNscSymbolTable *local_48;
  NscSymType in_stack_ffffffffffffffc4;
  NscType nType_00;
  char *in_stack_ffffffffffffffc8;
  CNscSymbolTable *in_stack_ffffffffffffffd0;
  
  if (in_RDI->m_nStructs < 0x80) {
    iVar1 = in_RDI->m_nStructs;
    pNVar2 = CNscSymbolTable::Add
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                        in_stack_ffffffffffffffc4);
    (pNVar2->field_6).field_0.nToken = iVar1 + 0x20;
    (pNVar2->field_6).field_0.nEngineObject = 0;
    (pNVar2->field_6).field_2.nStackOffset = 0;
    this_00 = (CNscContext *)CNscSymbolTable::GetSymbolOffset(&in_RDI->m_sSymbols,pNVar2);
    nType_00 = NscType_Unknown;
    this_02 = (CNscSymbolTable *)((long)(in_RDX->m_sFence).anHashStart + in_RCX + -0x60);
    for (local_48 = in_RDX; local_48 < this_02;
        local_48 = (CNscSymbolTable *)
                   (in_stack_ffffffffffffffa8->m_pauchData + -0x28 +
                   (long)((local_48->m_sFence).anHashStart + -7))) {
      in_stack_ffffffffffffffa8 = local_48;
      iVar1 = GetTypeSize(this_00,nType_00);
      nType_00 = iVar1 + nType_00;
    }
    this_01 = (CNscContext *)
              CNscSymbolTable::AppendData
                        (this_02,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    CNscSymbolTable::AppendData(this_02,in_stack_ffffffffffffffa8,(size_t)this_01);
    pNVar2 = CNscSymbolTable::GetSymbol((CNscSymbolTable *)this_01,(size_t)in_RDI);
    (pNVar2->field_6).field_1.nFirstBackLink = (size_t)this_01;
    iVar1 = GetCurrentSourceFile(in_RDI);
    pNVar2->nFile = iVar1;
    iVar1 = GetCurrentLine(in_RDI);
    pNVar2->nLine = iVar1;
    iVar1 = in_RDI->m_nStructs;
    in_RDI->m_nStructs = iVar1 + 1;
    in_RDI->m_anStructSymbol[iVar1] = (size_t)this_00;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_02,
               (value_type_conflict1 *)in_stack_ffffffffffffffa8);
    MarkGlobalIdentifierSymbol(this_01,(NscSymbol *)in_RDI);
  }
  else {
    GenerateMessage(in_RDI,NscMessage_ErrorTooManyStructures,(ulong)(uint)in_RDI->m_nStructs);
  }
  return;
}

Assistant:

void CNscContext::AddStructure (const char *pszIdentifier, 
	unsigned char *pauchStructData, size_t nStructDataSize)
{

	//
	// Make sure we still have room
	//

	if (m_nStructs >= Max_Structs)
	{
		GenerateMessage (NscMessage_ErrorTooManyStructures, m_nStructs);
		return;
	}

	//
	// Add a new symbol
	//

	NscType nType = (NscType) (NscType_Struct_0 + m_nStructs);
	NscSymbol *pSymbol = m_sSymbols .Add (
		pszIdentifier, NscSymType_Structure);
	pSymbol ->nType = nType;
	pSymbol ->ulFlags = 0;
	pSymbol ->nStackOffset = 0;
	size_t nSymbol = m_sSymbols .GetSymbolOffset (pSymbol);

	//
	// Count the number of elements
	//

	NscSymbolStructExtra sExtra;
	sExtra .nElementCount = 0;
	sExtra .nTotalSize = 0;
	unsigned char *pauchData = pauchStructData;
	unsigned char *pauchEnd = &pauchData [nStructDataSize];
	while (pauchData < pauchEnd)
	{
		NscPCodeHeader *p = (NscPCodeHeader *) pauchData;
		sExtra .nElementCount++;
		sExtra .nTotalSize += GetTypeSize (p ->nType);
		pauchData += p ->nOpSize;
	}

	//
	// Add the symbol data
	//

	size_t nExtra = m_sSymbols .AppendData (&sExtra, sizeof (sExtra));
	m_sSymbols .AppendData (pauchStructData, nStructDataSize);

	//
	// Save the data
	//

	pSymbol = m_sSymbols .GetSymbol (nSymbol);
	pSymbol ->nExtra = nExtra;
	pSymbol ->nFile = GetCurrentSourceFile ();
	pSymbol ->nLine = GetCurrentLine ();

	//
	// Save the symbol offset
	//

	m_anStructSymbol [m_nStructs++] = nSymbol;
	m_anGlobalDefs .push_back (nSymbol);
	MarkGlobalIdentifierSymbol (pSymbol);
}